

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestDefaultStatements::Run(ParserTestDefaultStatements *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  string err;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_50;
  string local_38;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild a: cat foo\nbuild b: cat foo\nbuild c: cat foo\nbuild d: cat foo\nthird = c\ndefault a b\ndefault $third\n"
            );
  if (iVar1 == g_current_test->assertion_failures_) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    State::DefaultNodes((vector<Node_*,_std::allocator<Node_*>_> *)&local_50,
                        &(this->super_ParserTest).state,&local_38);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_38);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x424,"\"\" == err");
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)local_50._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_50._M_impl.super__Vector_impl_data._M_start == 0x18,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x425,"3u == nodes.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      bVar3 = std::operator==("a",&(*local_50._M_impl.super__Vector_impl_data._M_start)->path_);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x426,"\"a\" == nodes[0]->path()");
      pTVar2 = g_current_test;
      bVar3 = std::operator==("b",&local_50._M_impl.super__Vector_impl_data._M_start[1]->path_);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x427,"\"b\" == nodes[1]->path()");
      pTVar2 = g_current_test;
      bVar3 = std::operator==("c",&local_50._M_impl.super__Vector_impl_data._M_start[2]->path_);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x428,"\"c\" == nodes[2]->path()");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_50);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, DefaultStatements) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat foo\n"
"build b: cat foo\n"
"build c: cat foo\n"
"build d: cat foo\n"
"third = c\n"
"default a b\n"
"default $third\n"));

  string err;
  vector<Node*> nodes = state.DefaultNodes(&err);
  EXPECT_EQ("", err);
  ASSERT_EQ(3u, nodes.size());
  EXPECT_EQ("a", nodes[0]->path());
  EXPECT_EQ("b", nodes[1]->path());
  EXPECT_EQ("c", nodes[2]->path());
}